

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParseInsertion(DXFImporter *this,LineReader *reader,FileData *output)

{
  int iVar1;
  pointer pIVar2;
  float fVar3;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_68._0_4_ = 0.0;
  local_68._4_4_ = 0.0;
  local_68._8_4_ = 0.0;
  local_68._12_4_ = 1.0;
  local_68._16_4_ = 1.0;
  local_68._20_4_ = 1.0;
  local_68._24_4_ = 0.0;
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::
  emplace_back<Assimp::DXF::InsertBlock>
            (&(output->blocks).
              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].insertions,(InsertBlock *)local_68);
  std::__cxx11::string::~string((string *)&local_48);
  pIVar2 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].insertions.
           super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (1 < reader->end) {
      return;
    }
    iVar1 = reader->groupcode;
    switch(iVar1) {
    case 0x29:
      fVar3 = DXF::LineReader::ValueAsFloat(reader);
      pIVar2[-1].scale.x = fVar3;
      break;
    case 0x2a:
      fVar3 = DXF::LineReader::ValueAsFloat(reader);
      pIVar2[-1].scale.y = fVar3;
      break;
    case 0x2b:
      fVar3 = DXF::LineReader::ValueAsFloat(reader);
      pIVar2[-1].scale.z = fVar3;
      break;
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
      break;
    case 0x32:
      fVar3 = DXF::LineReader::ValueAsFloat(reader);
      pIVar2[-1].angle = fVar3;
      break;
    default:
      if (iVar1 == 2) {
        std::__cxx11::string::_M_assign((string *)&pIVar2[-1].name);
      }
      else if (iVar1 == 10) {
        fVar3 = DXF::LineReader::ValueAsFloat(reader);
        pIVar2[-1].pos.x = fVar3;
      }
      else if (iVar1 == 0x14) {
        fVar3 = DXF::LineReader::ValueAsFloat(reader);
        pIVar2[-1].pos.y = fVar3;
      }
      else if (iVar1 == 0x1e) {
        fVar3 = DXF::LineReader::ValueAsFloat(reader);
        pIVar2[-1].pos.z = fVar3;
      }
      else if (iVar1 == 0) {
        return;
      }
    }
    DXF::LineReader::operator++(reader);
  } while( true );
}

Assistant:

void DXFImporter::ParseInsertion(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().insertions.push_back( DXF::InsertBlock() );
    DXF::InsertBlock& bl = output.blocks.back().insertions.back();

    while( !reader.End() && !reader.Is(0)) {
        switch(reader.GroupCode()) {
            // name of referenced block
        case GroupCode_Name:
            bl.name = reader.Value();
            break;

            // translation
        case GroupCode_XComp:
            bl.pos.x = reader.ValueAsFloat();
            break;
        case GroupCode_YComp:
            bl.pos.y = reader.ValueAsFloat();
            break;
        case GroupCode_ZComp:
            bl.pos.z = reader.ValueAsFloat();
            break;

            // scaling
        case 41:
            bl.scale.x = reader.ValueAsFloat();
            break;
        case 42:
            bl.scale.y = reader.ValueAsFloat();
            break;
        case 43:
            bl.scale.z = reader.ValueAsFloat();
            break;

            // rotation angle
        case 50:
            bl.angle = reader.ValueAsFloat();
            break;
        }
        reader++;
    }
}